

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

bool primesum::test(void)

{
  undefined1 x_00 [16];
  undefined1 x_01 [16];
  undefined1 x_02 [16];
  undefined1 x_03 [16];
  undefined1 x_04 [16];
  undefined1 x_05 [16];
  undefined1 x_06 [16];
  undefined1 x_07 [16];
  undefined1 x_08 [16];
  undefined1 x_09 [16];
  int256_t res1;
  int256_t res1_00;
  int256_t res1_01;
  int256_t res1_02;
  int256_t res1_03;
  int256_t res1_04;
  int256_t res1_05;
  int256_t res1_06;
  int256_t res1_07;
  int256_t res1_08;
  int256_t res1_09;
  int256_t res1_10;
  int256_t res1_11;
  int256_t res1_12;
  int256_t res2;
  int256_t res2_00;
  int256_t res2_01;
  int256_t res2_02;
  int256_t res2_03;
  int256_t res2_04;
  int256_t res2_05;
  int256_t res2_06;
  int256_t res2_07;
  int256_t res2_08;
  int256_t res2_09;
  int256_t res2_10;
  int256_t res2_11;
  int256_t res2_12;
  int iVar1;
  time_t tVar2;
  ostream *poVar3;
  long extraout_RDX;
  long extraout_RDX_00;
  int64_t x;
  primesum *ppVar4;
  int64_t i_4;
  primesum *ppVar5;
  int64_t i;
  long lVar6;
  int64_t i_5;
  char *__end;
  long lVar7;
  int64_t in_stack_fffffffffffffbd8;
  int64_t iVar8;
  long in_stack_fffffffffffffbe0;
  long lVar9;
  string local_3e0;
  double local_3c0;
  int64_t local_3b8;
  long lStack_3b0;
  long local_3a8;
  long lStack_3a0;
  int64_t local_398;
  long lStack_390;
  long local_388;
  long lStack_380;
  int64_t local_378;
  long lStack_370;
  long local_368;
  long lStack_360;
  int64_t local_358;
  long lStack_350;
  long local_348;
  long lStack_340;
  int64_t local_338;
  long lStack_330;
  long local_328;
  long lStack_320;
  int64_t local_318;
  long lStack_310;
  long local_308;
  long lStack_300;
  int64_t local_2f8;
  long lStack_2f0;
  long local_2e8;
  long lStack_2e0;
  int64_t local_2d8;
  long lStack_2d0;
  long local_2c8;
  long lStack_2c0;
  int64_t local_2b8;
  long lStack_2b0;
  long local_2a8;
  long lStack_2a0;
  int64_t local_298;
  long lStack_290;
  long local_288;
  long lStack_280;
  int64_t local_278;
  long lStack_270;
  long local_268;
  long lStack_260;
  int64_t local_258;
  long lStack_250;
  long local_248;
  long lStack_240;
  int64_t local_238;
  long lStack_230;
  long local_228;
  long lStack_220;
  int64_t local_218;
  long lStack_210;
  long local_208;
  long lStack_200;
  int64_t local_1f8;
  long lStack_1f0;
  long local_1e8;
  long lStack_1e0;
  int64_t local_1d8;
  long lStack_1d0;
  long local_1c8;
  long lStack_1c0;
  int128_t *local_1b8;
  long local_1a8;
  long lStack_1a0;
  int128_t *local_198;
  long local_188;
  long lStack_180;
  int256_t local_178;
  int256_t local_158;
  int256_t local_138;
  int256_t local_118;
  int256_t local_f8;
  int256_t local_d8;
  int256_t local_b8;
  int256_t local_98;
  int256_t local_78;
  int256_t local_58;
  
  set_print(false);
  tVar2 = time((time_t *)0x0);
  srand((uint)tVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Testing ",8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"pi_lmo1",7);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(x)",3);
  std::ostream::flush();
  ppVar4 = (primesum *)0x0;
  do {
    local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e0,"pi_lmo1","");
    x_00._8_8_ = in_stack_fffffffffffffbe0;
    x_00._0_8_ = in_stack_fffffffffffffbd8;
    ppVar5 = ppVar4;
    pi_lmo1(&local_58,ppVar4,(int128_t)x_00);
    local_198 = prime_sum_tiny((int128_t *)ppVar4,(int64_t)ppVar5);
    local_188 = extraout_RDX >> 0x3f;
    res1.low._8_8_ = local_58.low._8_8_;
    res1.low._0_8_ = (int64_t)local_58.low;
    res1.high._0_8_ = (undefined8)local_58.high;
    res1.high._8_8_ = local_58.high._8_8_;
    res2.low._8_8_ = extraout_RDX;
    res2.low._0_8_ = local_198;
    res2.high._0_8_ = local_188;
    res2.high._8_8_ = local_188;
    in_stack_fffffffffffffbd8 = (int64_t)local_58.low;
    in_stack_fffffffffffffbe0 = local_58.low._8_8_;
    lStack_180 = local_188;
    anon_unknown.dwarf_8431e::check_equal(&local_3e0,(int64_t)ppVar4,res1,res2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
      operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
    }
    ppVar4 = ppVar4 + 1;
  } while (ppVar4 != (primesum *)0x2710);
  ppVar4 = (primesum *)0x0;
  lVar6 = 0;
  do {
    local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e0,"pi_lmo1","");
    x_01._8_8_ = in_stack_fffffffffffffbe0;
    x_01._0_8_ = in_stack_fffffffffffffbd8;
    ppVar5 = ppVar4;
    pi_lmo1(&local_78,ppVar4,(int128_t)x_01);
    local_1b8 = prime_sum_tiny((int128_t *)ppVar4,(int64_t)ppVar5);
    local_1a8 = extraout_RDX_00 >> 0x3f;
    res1_00.low._8_8_ = local_78.low._8_8_;
    res1_00.low._0_8_ = (int64_t)local_78.low;
    res1_00.high._0_8_ = (undefined8)local_78.high;
    res1_00.high._8_8_ = local_78.high._8_8_;
    res2_00.low._8_8_ = extraout_RDX_00;
    res2_00.low._0_8_ = local_1b8;
    res2_00.high._0_8_ = local_1a8;
    res2_00.high._8_8_ = local_1a8;
    in_stack_fffffffffffffbd8 = (int64_t)local_78.low;
    in_stack_fffffffffffffbe0 = local_78.low._8_8_;
    lStack_1a0 = local_1a8;
    anon_unknown.dwarf_8431e::check_equal(&local_3e0,(int64_t)ppVar4,res1_00,res2_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
      operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
    }
    local_3c0 = (((double)lVar6 + 1.0) * 100.0) / 50.0;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\rTesting ",9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"pi_lmo1(x) ",0xb);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)local_3c0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"%",1);
    std::ostream::flush();
    lVar6 = lVar6 + 1;
    iVar1 = rand();
    ppVar4 = ppVar4 + (iVar1 * 1000 + (iVar1 / 10000) * -10000000 + 1);
  } while (lVar6 != 0x32);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Testing ",8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"pi_lmo2",7);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(x)",3);
  std::ostream::flush();
  ppVar4 = (primesum *)0x0;
  do {
    local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e0,"pi_lmo2","");
    local_1d8 = pi_lmo2((int64_t)ppVar4);
    lStack_1d0 = local_1d8 >> 0x3f;
    x_02._8_8_ = in_stack_fffffffffffffbe0;
    x_02._0_8_ = in_stack_fffffffffffffbd8;
    local_1c8 = lStack_1d0;
    lStack_1c0 = lStack_1d0;
    pi_lmo1(&local_98,ppVar4,(int128_t)x_02);
    res1_01.low._8_8_ = lStack_1d0;
    res1_01.low._0_8_ = local_1d8;
    res1_01.high._0_8_ = local_1c8;
    res1_01.high._8_8_ = lStack_1c0;
    res2_01.low._8_8_ = local_98.low._8_8_;
    res2_01.low._0_8_ = (undefined8)local_98.low;
    res2_01.high._0_8_ = (undefined8)local_98.high;
    res2_01.high._8_8_ = local_98.high._8_8_;
    in_stack_fffffffffffffbd8 = local_1d8;
    in_stack_fffffffffffffbe0 = lStack_1d0;
    anon_unknown.dwarf_8431e::check_equal(&local_3e0,(int64_t)ppVar4,res1_01,res2_01);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
      operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
    }
    ppVar4 = ppVar4 + 1;
  } while (ppVar4 != (primesum *)0x2710);
  ppVar4 = (primesum *)0x0;
  lVar6 = 0;
  do {
    local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e0,"pi_lmo2","");
    local_1f8 = pi_lmo2((int64_t)ppVar4);
    lStack_1f0 = local_1f8 >> 0x3f;
    x_03._8_8_ = in_stack_fffffffffffffbe0;
    x_03._0_8_ = in_stack_fffffffffffffbd8;
    local_1e8 = lStack_1f0;
    lStack_1e0 = lStack_1f0;
    pi_lmo1(&local_b8,ppVar4,(int128_t)x_03);
    res1_02.low._8_8_ = lStack_1f0;
    res1_02.low._0_8_ = local_1f8;
    res1_02.high._0_8_ = local_1e8;
    res1_02.high._8_8_ = lStack_1e0;
    res2_02.low._8_8_ = local_b8.low._8_8_;
    res2_02.low._0_8_ = (undefined8)local_b8.low;
    res2_02.high._0_8_ = (undefined8)local_b8.high;
    res2_02.high._8_8_ = local_b8.high._8_8_;
    in_stack_fffffffffffffbd8 = local_1f8;
    in_stack_fffffffffffffbe0 = lStack_1f0;
    anon_unknown.dwarf_8431e::check_equal(&local_3e0,(int64_t)ppVar4,res1_02,res2_02);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
      operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
    }
    local_3c0 = (double)lVar6 + 1.0;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\rTesting ",9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"pi_lmo2(x) ",0xb);
    poVar3 = (ostream *)
             std::ostream::operator<<((ostream *)&std::cout,(int)((local_3c0 * 100.0) / 100.0));
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"%",1);
    std::ostream::flush();
    lVar6 = lVar6 + 1;
    iVar1 = rand();
    ppVar4 = ppVar4 + (iVar1 * 1000 + (iVar1 / 10000) * -10000000 + 1);
  } while (lVar6 != 100);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Testing ",8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"pi_lmo3",7);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(x)",3);
  std::ostream::flush();
  lVar6 = 0;
  do {
    local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e0,"pi_lmo3","");
    local_218 = pi_lmo3(lVar6);
    lStack_210 = local_218 >> 0x3f;
    local_208 = lStack_210;
    lStack_200 = lStack_210;
    local_238 = pi_lmo2(lVar6);
    lStack_230 = local_238 >> 0x3f;
    res1_03.low._8_8_ = lStack_210;
    res1_03.low._0_8_ = local_218;
    res1_03.high._0_8_ = local_208;
    res1_03.high._8_8_ = lStack_200;
    res2_03.high._0_8_ = lStack_230;
    res2_03.low = (uint128_t)SEXT816(local_238);
    res2_03.high._8_8_ = lStack_230;
    local_228 = lStack_230;
    lStack_220 = lStack_230;
    anon_unknown.dwarf_8431e::check_equal(&local_3e0,lVar6,res1_03,res2_03);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
      operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 10000);
  lVar6 = 0;
  lVar7 = 0;
  do {
    local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e0,"pi_lmo3","");
    local_258 = pi_lmo3(lVar6);
    lStack_250 = local_258 >> 0x3f;
    local_248 = lStack_250;
    lStack_240 = lStack_250;
    local_278 = pi_lmo2(lVar6);
    lStack_270 = local_278 >> 0x3f;
    res1_04.low._8_8_ = lStack_250;
    res1_04.low._0_8_ = local_258;
    res1_04.high._0_8_ = local_248;
    res1_04.high._8_8_ = lStack_240;
    res2_04.high._0_8_ = lStack_270;
    res2_04.low = (uint128_t)SEXT816(local_278);
    res2_04.high._8_8_ = lStack_270;
    local_268 = lStack_270;
    lStack_260 = lStack_270;
    anon_unknown.dwarf_8431e::check_equal(&local_3e0,lVar6,res1_04,res2_04);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
      operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
    }
    local_3c0 = (((double)lVar7 + 1.0) * 100.0) / 300.0;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\rTesting ",9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"pi_lmo3(x) ",0xb);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)local_3c0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"%",1);
    std::ostream::flush();
    lVar7 = lVar7 + 1;
    iVar1 = rand();
    lVar6 = lVar6 + (iVar1 * 1000 + (iVar1 / 10000) * -10000000 + 1);
  } while (lVar7 != 300);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Testing ",8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"pi_lmo4",7);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(x)",3);
  std::ostream::flush();
  lVar6 = 0;
  do {
    local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e0,"pi_lmo4","");
    local_298 = pi_lmo4(lVar6);
    lStack_290 = local_298 >> 0x3f;
    local_288 = lStack_290;
    lStack_280 = lStack_290;
    local_2b8 = pi_lmo3(lVar6);
    lStack_2b0 = local_2b8 >> 0x3f;
    res1_05.low._8_8_ = lStack_290;
    res1_05.low._0_8_ = local_298;
    res1_05.high._0_8_ = local_288;
    res1_05.high._8_8_ = lStack_280;
    res2_05.high._0_8_ = lStack_2b0;
    res2_05.low = (uint128_t)SEXT816(local_2b8);
    res2_05.high._8_8_ = lStack_2b0;
    local_2a8 = lStack_2b0;
    lStack_2a0 = lStack_2b0;
    anon_unknown.dwarf_8431e::check_equal(&local_3e0,lVar6,res1_05,res2_05);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
      operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 10000);
  lVar6 = 0;
  lVar7 = 0;
  do {
    local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e0,"pi_lmo4","");
    local_2d8 = pi_lmo4(lVar6);
    lStack_2d0 = local_2d8 >> 0x3f;
    local_2c8 = lStack_2d0;
    lStack_2c0 = lStack_2d0;
    local_2f8 = pi_lmo3(lVar6);
    lStack_2f0 = local_2f8 >> 0x3f;
    res1_06.low._8_8_ = lStack_2d0;
    res1_06.low._0_8_ = local_2d8;
    res1_06.high._0_8_ = local_2c8;
    res1_06.high._8_8_ = lStack_2c0;
    res2_06.high._0_8_ = lStack_2f0;
    res2_06.low = (uint128_t)SEXT816(local_2f8);
    res2_06.high._8_8_ = lStack_2f0;
    local_2e8 = lStack_2f0;
    lStack_2e0 = lStack_2f0;
    anon_unknown.dwarf_8431e::check_equal(&local_3e0,lVar6,res1_06,res2_06);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
      operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
    }
    local_3c0 = (((double)lVar7 + 1.0) * 100.0) / 400.0;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\rTesting ",9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"pi_lmo4(x) ",0xb);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)local_3c0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"%",1);
    std::ostream::flush();
    lVar7 = lVar7 + 1;
    iVar1 = rand();
    lVar6 = lVar6 + (iVar1 * 1000 + (iVar1 / 10000) * -10000000 + 1);
  } while (lVar7 != 400);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Testing ",8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"pi_lmo5",7);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(x)",3);
  std::ostream::flush();
  lVar6 = 0;
  do {
    local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e0,"pi_lmo5","");
    local_318 = pi_lmo5(lVar6);
    lStack_310 = local_318 >> 0x3f;
    local_308 = lStack_310;
    lStack_300 = lStack_310;
    local_338 = pi_lmo4(lVar6);
    lStack_330 = local_338 >> 0x3f;
    res1_07.low._8_8_ = lStack_310;
    res1_07.low._0_8_ = local_318;
    res1_07.high._0_8_ = local_308;
    res1_07.high._8_8_ = lStack_300;
    res2_07.high._0_8_ = lStack_330;
    res2_07.low = (uint128_t)SEXT816(local_338);
    res2_07.high._8_8_ = lStack_330;
    local_328 = lStack_330;
    lStack_320 = lStack_330;
    anon_unknown.dwarf_8431e::check_equal(&local_3e0,lVar6,res1_07,res2_07);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
      operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 10000);
  lVar6 = 0;
  lVar7 = 0;
  do {
    local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e0,"pi_lmo5","");
    local_358 = pi_lmo5(lVar7);
    lStack_350 = local_358 >> 0x3f;
    local_348 = lStack_350;
    lStack_340 = lStack_350;
    local_378 = pi_lmo4(lVar7);
    lStack_370 = local_378 >> 0x3f;
    res1_08.low._8_8_ = lStack_350;
    res1_08.low._0_8_ = local_358;
    res1_08.high._0_8_ = local_348;
    res1_08.high._8_8_ = lStack_340;
    res2_08.high._0_8_ = lStack_370;
    res2_08.low = (uint128_t)SEXT816(local_378);
    res2_08.high._8_8_ = lStack_370;
    iVar8 = local_358;
    lVar9 = lStack_350;
    local_368 = lStack_370;
    lStack_360 = lStack_370;
    anon_unknown.dwarf_8431e::check_equal(&local_3e0,lVar7,res1_08,res2_08);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
      operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
    }
    local_3c0 = (((double)lVar6 + 1.0) * 100.0) / 600.0;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\rTesting ",9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"pi_lmo5(x) ",0xb);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)local_3c0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"%",1);
    std::ostream::flush();
    lVar6 = lVar6 + 1;
    iVar1 = rand();
    lVar7 = lVar7 + (iVar1 * 1000 + (iVar1 / 10000) * -10000000 + 1);
  } while (lVar6 != 600);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Testing ",8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"pi_lmo_parallel1",0x10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(x)",3);
  std::ostream::flush();
  ppVar4 = (primesum *)0x0;
  do {
    local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e0,"pi_lmo_parallel1","");
    get_num_threads();
    x_04._8_8_ = lVar9;
    x_04._0_8_ = iVar8;
    pi_lmo_parallel1(&local_d8,ppVar4,(int128_t)x_04,0);
    local_398 = pi_lmo5((int64_t)ppVar4);
    lStack_390 = local_398 >> 0x3f;
    res1_09.low._8_8_ = local_d8.low._8_8_;
    res1_09.low._0_8_ = (int64_t)local_d8.low;
    res1_09.high._0_8_ = (undefined8)local_d8.high;
    res1_09.high._8_8_ = local_d8.high._8_8_;
    res2_09.high._0_8_ = lStack_390;
    res2_09.low = (uint128_t)SEXT816(local_398);
    res2_09.high._8_8_ = lStack_390;
    iVar8 = (int64_t)local_d8.low;
    lVar9 = local_d8.low._8_8_;
    local_388 = lStack_390;
    lStack_380 = lStack_390;
    anon_unknown.dwarf_8431e::check_equal(&local_3e0,(int64_t)ppVar4,res1_09,res2_09);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
      operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
    }
    ppVar4 = ppVar4 + 1;
  } while (ppVar4 != (primesum *)0x2710);
  lVar6 = 0;
  ppVar4 = (primesum *)0x0;
  do {
    local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e0,"pi_lmo_parallel1","");
    get_num_threads();
    x_05._8_8_ = lVar9;
    x_05._0_8_ = iVar8;
    pi_lmo_parallel1(&local_f8,ppVar4,(int128_t)x_05,(int)((long)ppVar4 >> 0x3f));
    local_3b8 = pi_lmo5((int64_t)ppVar4);
    lStack_3b0 = local_3b8 >> 0x3f;
    res1_10.low._8_8_ = local_f8.low._8_8_;
    res1_10.low._0_8_ = (int64_t)local_f8.low;
    res1_10.high._0_8_ = (undefined8)local_f8.high;
    res1_10.high._8_8_ = local_f8.high._8_8_;
    res2_10.high._0_8_ = lStack_3b0;
    res2_10.low = (uint128_t)SEXT816(local_3b8);
    res2_10.high._8_8_ = lStack_3b0;
    iVar8 = (int64_t)local_f8.low;
    lVar9 = local_f8.low._8_8_;
    local_3a8 = lStack_3b0;
    lStack_3a0 = lStack_3b0;
    anon_unknown.dwarf_8431e::check_equal(&local_3e0,(int64_t)ppVar4,res1_10,res2_10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
      operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
    }
    local_3c0 = (((double)lVar6 + 1.0) * 100.0) / 600.0;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\rTesting ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"pi_lmo_parallel1(x) ",0x14);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)local_3c0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"%",1);
    std::ostream::flush();
    lVar6 = lVar6 + 1;
    iVar1 = rand();
    ppVar4 = ppVar4 + (iVar1 * 1000 + (iVar1 / 10000) * -10000000 + 1);
  } while (lVar6 != 600);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Testing ",8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"pi_deleglise_rivat_parallel1",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(x)",3);
  std::ostream::flush();
  ppVar4 = (primesum *)0x0;
  do {
    local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_3e0,"pi_deleglise_rivat_parallel1","");
    get_num_threads();
    x_06._8_8_ = lVar9;
    x_06._0_8_ = iVar8;
    pi_deleglise_rivat_parallel1(&local_118,ppVar4,(int128_t)x_06,0);
    get_num_threads();
    x_07._8_8_ = lVar9;
    x_07._0_8_ = iVar8;
    pi_lmo_parallel1(&local_138,ppVar4,(int128_t)x_07,0);
    res1_11.low._8_8_ = local_118.low._8_8_;
    res1_11.low._0_8_ = (int64_t)local_118.low;
    res1_11.high._0_8_ = (undefined8)local_118.high;
    res1_11.high._8_8_ = local_118.high._8_8_;
    res2_11.low._8_8_ = local_138.low._8_8_;
    res2_11.low._0_8_ = (undefined8)local_138.low;
    res2_11.high._0_8_ = (undefined8)local_138.high;
    res2_11.high._8_8_ = local_138.high._8_8_;
    iVar8 = (int64_t)local_118.low;
    lVar9 = local_118.low._8_8_;
    anon_unknown.dwarf_8431e::check_equal(&local_3e0,(int64_t)ppVar4,res1_11,res2_11);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
      operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
    }
    ppVar4 = ppVar4 + 1;
  } while (ppVar4 != (primesum *)0x2710);
  lVar6 = 0;
  ppVar4 = (primesum *)0x0;
  do {
    local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_3e0,"pi_deleglise_rivat_parallel1","");
    get_num_threads();
    x_08._8_8_ = lVar9;
    x_08._0_8_ = iVar8;
    iVar1 = (int)((long)ppVar4 >> 0x3f);
    pi_deleglise_rivat_parallel1(&local_158,ppVar4,(int128_t)x_08,iVar1);
    get_num_threads();
    x_09._8_8_ = lVar9;
    x_09._0_8_ = iVar8;
    pi_lmo_parallel1(&local_178,ppVar4,(int128_t)x_09,iVar1);
    res1_12.low._8_8_ = local_158.low._8_8_;
    res1_12.low._0_8_ = (int64_t)local_158.low;
    res1_12.high._0_8_ = (undefined8)local_158.high;
    res1_12.high._8_8_ = local_158.high._8_8_;
    res2_12.low._8_8_ = local_178.low._8_8_;
    res2_12.low._0_8_ = (undefined8)local_178.low;
    res2_12.high._0_8_ = (undefined8)local_178.high;
    res2_12.high._8_8_ = local_178.high._8_8_;
    iVar8 = (int64_t)local_158.low;
    lVar9 = local_158.low._8_8_;
    anon_unknown.dwarf_8431e::check_equal(&local_3e0,(int64_t)ppVar4,res1_12,res2_12);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
      operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
    }
    local_3c0 = (((double)lVar6 + 1.0) * 100.0) / 900.0;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\rTesting ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"pi_deleglise_rivat_parallel1(x) ",0x20);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)local_3c0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"%",1);
    std::ostream::flush();
    lVar6 = lVar6 + 1;
    iVar1 = rand();
    ppVar4 = ppVar4 + (iVar1 * 1000 + (iVar1 / 10000) * -10000000 + 1);
  } while (lVar6 != 900);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"All tests passed successfully!",0x1e);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  std::ostream::flush();
  return true;
}

Assistant:

bool test()
{
  set_print(false); 
  srand(static_cast<unsigned>(time(0)));

  try
  {
#ifdef _OPENMP
    test_phi_thread_safety(100);
#endif

    CHECK_EQUAL(pi_lmo1,                         prime_sum_tiny,      CHECK_11,  50);
    CHECK_EQUAL(pi_lmo2,                         pi_lmo1,             CHECK_11,  100);
    CHECK_EQUAL(pi_lmo3,                         pi_lmo2,             CHECK_11,  300);
    CHECK_EQUAL(pi_lmo4,                         pi_lmo3,             CHECK_11,  400);
    CHECK_EQUAL(pi_lmo5,                         pi_lmo4,             CHECK_11,  600);
    CHECK_EQUAL(pi_lmo_parallel1,                pi_lmo5,             CHECK_21,  600);
    CHECK_EQUAL(pi_deleglise_rivat_parallel1,    pi_lmo_parallel1,    CHECK_22,  900);
  }
  catch (exception& e)
  {
    cerr << endl << e.what() << endl;
    return false;
  }

  cout << "All tests passed successfully!" << endl;
  return true;
}